

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O3

void do_eat(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  short sVar2;
  bool bVar3;
  int iVar4;
  OBJ_DATA *obj;
  char *pcVar5;
  AFFECT_DATA af;
  char arg [4608];
  AFFECT_DATA local_1290;
  char local_1228 [4608];
  
  one_argument(argument,local_1228);
  if (local_1228[0] == '\0') {
    pcVar5 = "Eat what?\n\r";
LAB_0025c797:
    send_to_char(pcVar5,ch);
    return;
  }
  obj = get_obj_carry(ch,local_1228,ch);
  if (obj == (OBJ_DATA *)0x0) {
    pcVar5 = "You do not have that item.\n\r";
    goto LAB_0025c797;
  }
  if (ch->fighting != (CHAR_DATA *)0x0) {
    pcVar5 = "You\'re too busy fighting to worry about food.\n\r";
    goto LAB_0025c797;
  }
  bVar3 = is_immortal(ch);
  if (!bVar3) {
    if ((obj->item_type != 0x13) && (obj->item_type != 0x1a)) {
      pcVar5 = "That\'s not edible.\n\r";
      goto LAB_0025c797;
    }
    bVar3 = is_npc(ch);
    if ((!bVar3) && (ch->pcdata->condition[3] < 5)) {
      pcVar5 = "You are too full to eat more.\n\r";
      goto LAB_0025c797;
    }
  }
  act("$n eats $p.",ch,obj,(void *)0x0,0);
  act("You eat $p.",ch,obj,(void *)0x0,3);
  if (obj->item_type == 0x1a) {
    obj_cast_spell(obj->value[1],obj->value[0],ch,ch,(OBJ_DATA *)0x0);
    obj_cast_spell(obj->value[2],obj->value[0],ch,ch,(OBJ_DATA *)0x0);
    obj_cast_spell(obj->value[3],obj->value[0],ch,ch,(OBJ_DATA *)0x0);
    goto LAB_0025c9cc;
  }
  if (obj->item_type != 0x13) goto LAB_0025c9cc;
  bVar3 = is_npc(ch);
  if (!bVar3) {
    sVar1 = ch->pcdata->condition[3];
    gain_condition(ch,3,obj->value[1] * -3);
    sVar2 = ch->pcdata->condition[3];
    if ((sVar2 < 0x32) && (0x32 < sVar1)) {
      pcVar5 = "You are no longer hungry.\n\r";
    }
    else {
      if (4 < sVar2) goto LAB_0025c915;
      pcVar5 = "You are full.\n\r";
    }
    send_to_char(pcVar5,ch);
  }
LAB_0025c915:
  if (obj->value[3] != 0) {
    act("$n chokes and gags.",ch,(void *)0x0,(void *)0x0,0);
    send_to_char("You choke and gag.\n\r",ch);
    bVar3 = is_affected(ch,(int)gsn_poison);
    if (!bVar3) {
      init_affect(&local_1290);
      local_1290.where = 0;
      local_1290.aftype = 3;
      local_1290.type = gsn_poison;
      iVar4 = number_fuzzy(obj->value[0]);
      local_1290.level = (short)iVar4;
      local_1290.duration = (short)obj->value[0] * 2;
      local_1290.location = 1;
      local_1290.modifier = -5;
      local_1290.bitvector[0]._1_1_ = local_1290.bitvector[0]._1_1_ | 0x10;
      local_1290.tick_fun = poison_tick;
      local_1290.owner = ch;
      affect_join(ch,&local_1290);
    }
  }
LAB_0025c9cc:
  extract_obj(obj);
  return;
}

Assistant:

void do_eat(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	OBJ_DATA *obj;

	one_argument(argument, arg);
	if (arg[0] == '\0')
	{
		send_to_char("Eat what?\n\r", ch);
		return;
	}

	obj = get_obj_carry(ch, arg, ch);

	if (obj == nullptr)
	{
		send_to_char("You do not have that item.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
	{
		send_to_char("You're too busy fighting to worry about food.\n\r", ch);
		return;
	}

	if (!is_immortal(ch))
	{
		if (obj->item_type != ITEM_FOOD && obj->item_type != ITEM_PILL)
		{
			send_to_char("That's not edible.\n\r", ch);
			return;
		}

		if (!is_npc(ch) && ch->pcdata->condition[COND_HUNGER] < 5)
		{
			send_to_char("You are too full to eat more.\n\r", ch);
			return;
		}
	}

	act("$n eats $p.", ch, obj, nullptr, TO_ROOM);
	act("You eat $p.", ch, obj, nullptr, TO_CHAR);

	switch (obj->item_type)
	{
		case ITEM_FOOD:
			if (!is_npc(ch))
			{
				int condition;

				condition = ch->pcdata->condition[COND_HUNGER];
				gain_condition(ch, COND_HUNGER, -(obj->value[1] * 3));

				if (ch->pcdata->condition[COND_HUNGER] < COND_HUNGRY && condition > COND_HUNGRY)
					send_to_char("You are no longer hungry.\n\r", ch);
				else if (ch->pcdata->condition[COND_HUNGER] < 5)
					send_to_char("You are full.\n\r", ch);
			}

			if (obj->value[3] != 0)
			{
				/* The food was poisoned! */
				AFFECT_DATA af;

				act("$n chokes and gags.", ch, 0, 0, TO_ROOM);
				send_to_char("You choke and gag.\n\r", ch);

				if (!is_affected(ch, gsn_poison))
				{
					init_affect(&af);
					af.where = TO_AFFECTS;
					af.aftype = AFT_MALADY;
					af.type = gsn_poison;
					af.level = number_fuzzy(obj->value[0]);
					af.duration = 2 * obj->value[0];
					af.location = APPLY_STR;
					af.modifier = -5;
					SET_BIT(af.bitvector, AFF_POISON);
					af.owner = ch;
					af.tick_fun = poison_tick;
					affect_join(ch, &af);
				}
			}

			break;
		case ITEM_PILL:
			obj_cast_spell(obj->value[1], obj->value[0], ch, ch, nullptr);
			obj_cast_spell(obj->value[2], obj->value[0], ch, ch, nullptr);
			obj_cast_spell(obj->value[3], obj->value[0], ch, ch, nullptr);
			break;
	}

	extract_obj(obj);
}